

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_list_view_end(nk_list_view *view)

{
  nk_context *ctx;
  nk_panel *pnVar1;
  
  if ((view != (nk_list_view *)0x0) && (ctx = view->ctx, ctx != (nk_context *)0x0)) {
    pnVar1 = ctx->current->layout;
    pnVar1->at_y = (float)view->total_height + (pnVar1->bounds).y;
    *view->scroll_pointer = *view->scroll_pointer + view->scroll_value;
    nk_group_scrolled_end(ctx);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_list_view_end(struct nk_list_view *view)
{
struct nk_context *ctx;
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(view);
NK_ASSERT(view->ctx);
NK_ASSERT(view->scroll_pointer);
if (!view || !view->ctx) return;

ctx = view->ctx;
win = ctx->current;
layout = win->layout;
layout->at_y = layout->bounds.y + (float)view->total_height;
*view->scroll_pointer = *view->scroll_pointer + view->scroll_value;
nk_group_end(view->ctx);
}